

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInAlsa::openPort(MidiInAlsa *this,uint portNumber,string *portName)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  snd_seq_t *seq;
  pointer pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  ostream *poVar12;
  string *psVar13;
  snd_seq_port_info_t *psVar14;
  undefined8 uStack_2c0;
  snd_seq_port_info_t asStack_2b8 [8];
  undefined1 local_2b0 [8];
  ostringstream ost;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined1 local_57;
  snd_seq_addr_t sender;
  undefined1 local_32;
  undefined1 local_31;
  snd_seq_addr_t receiver;
  
  psVar14 = asStack_2b8;
  if ((this->super_MidiInApi).super_MidiApi.connected_ == true) {
    psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
    uStack_2c0 = 0x10c6c0;
    std::__cxx11::string::assign((char *)psVar13);
    uStack_2c0 = 0x10c6d2;
    std::__cxx11::string::string((string *)&local_138,(string *)psVar13);
    uStack_2c0 = 0x10c6df;
    MidiApi::error((MidiApi *)this,WARNING,&local_138);
    psVar13 = &local_138;
    psVar14 = asStack_2b8;
  }
  else {
    uStack_2c0 = 0x10c6fa;
    iVar8 = (*(this->super_MidiInApi).super_MidiApi._vptr_MidiApi[8])(this);
    if (iVar8 != 0) {
      uStack_2c0 = 0x10c707;
      lVar10 = snd_seq_port_info_sizeof();
      lVar10 = -(lVar10 + 0xfU & 0xfffffffffffffff0);
      psVar14 = asStack_2b8 + lVar10;
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c71d;
      sVar11 = snd_seq_port_info_sizeof();
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c72a;
      memset(psVar14,0,sVar11);
      puVar3 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
      seq = (snd_seq_t *)*puVar3;
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x21;
      uVar5 = *(undefined8 *)(asStack_2b8 + lVar10 + -8);
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c740;
      uVar9 = portInfo(seq,psVar14,(uint)uVar5,portNumber);
      if (uVar9 == 0) {
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8a8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8b7;
        poVar12 = std::operator<<((ostream *)local_2b0,
                                  "MidiInAlsa::openPort: the \'portNumber\' argument (");
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8c2;
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8d1;
        std::operator<<(poVar12,") is invalid.");
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8e1;
        std::__cxx11::stringbuf::str();
        psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8f4;
        std::__cxx11::string::operator=((string *)psVar13,&local_58);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c8fc;
        std::__cxx11::string::~string(&local_58);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c908;
        std::__cxx11::string::string((string *)&local_78,(string *)psVar13);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 6;
        uVar5 = *(undefined8 *)(asStack_2b8 + lVar10 + -8);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c917;
        MidiApi::error((MidiApi *)this,(Type)uVar5,&local_78);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c920;
        std::__cxx11::string::~string((string *)&local_78);
        *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c92c;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
        return;
      }
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c750;
      local_58 = (string)snd_seq_port_info_get_client(psVar14);
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c75b;
      local_57 = snd_seq_port_info_get_port(psVar14);
      uVar5 = *puVar3;
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c767;
      local_32 = snd_seq_client_id(uVar5);
      *(undefined8 *)(asStack_2b8 + lVar10 + -8) = 0x10c76f;
      lVar10 = snd_seq_port_info_sizeof();
      psVar14 = psVar14 + -(lVar10 + 0xfU & 0xfffffffffffffff0);
      *(undefined8 *)(psVar14 + -8) = 0x10c785;
      sVar11 = snd_seq_port_info_sizeof();
      *(undefined8 *)(psVar14 + -8) = 0x10c792;
      memset(psVar14,0,sVar11);
      iVar8 = *(int *)((long)puVar3 + 0xc);
      if (iVar8 < 0) {
        *(undefined8 *)(psVar14 + -8) = 0x10c7a8;
        snd_seq_port_info_set_client(psVar14,0);
        *(undefined8 *)(psVar14 + -8) = 0x10c7b2;
        snd_seq_port_info_set_port(psVar14,0);
        *(undefined8 *)(psVar14 + -8) = 0x42;
        uVar5 = *(undefined8 *)(psVar14 + -8);
        *(undefined8 *)(psVar14 + -8) = 0x10c7bd;
        snd_seq_port_info_set_capability(psVar14,uVar5);
        *(undefined8 *)(psVar14 + -8) = 0x10c7ca;
        snd_seq_port_info_set_type(psVar14,0x100002);
        *(undefined8 *)(psVar14 + -8) = 0x10;
        uVar5 = *(undefined8 *)(psVar14 + -8);
        *(undefined8 *)(psVar14 + -8) = 0x10c7d5;
        snd_seq_port_info_set_midi_channels(psVar14,uVar5);
        *(undefined8 *)(psVar14 + -8) = 1;
        uVar6 = *(ulong *)(psVar14 + -8);
        *(undefined8 *)(psVar14 + -8) = 0x10c7e4;
        snd_seq_port_info_set_timestamping(psVar14,uVar6 & 0xffffffff);
        *(undefined8 *)(psVar14 + -8) = 0x10c7ef;
        snd_seq_port_info_set_timestamp_real(psVar14,uVar6 & 0xffffffff);
        uVar2 = *(undefined4 *)(puVar3 + 9);
        *(undefined8 *)(psVar14 + -8) = 0x10c7fb;
        snd_seq_port_info_set_timestamp_queue(psVar14,uVar2);
        pcVar4 = (portName->_M_dataplus)._M_p;
        *(undefined8 *)(psVar14 + -8) = 0x10c806;
        snd_seq_port_info_set_name(psVar14,pcVar4);
        uVar5 = *puVar3;
        *(undefined8 *)(psVar14 + -8) = 0x10c812;
        iVar8 = snd_seq_create_port(uVar5,psVar14);
        *(int *)((long)puVar3 + 0xc) = iVar8;
        if (iVar8 < 0) {
          psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
          *(undefined8 *)(psVar14 + -8) = 0x10caa9;
          std::__cxx11::string::assign((char *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 0x10cabb;
          std::__cxx11::string::string((string *)&local_f8,(string *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 8;
          uVar5 = *(undefined8 *)(psVar14 + -8);
          *(undefined8 *)(psVar14 + -8) = 0x10cac9;
          MidiApi::error((MidiApi *)this,(Type)uVar5,&local_f8);
          psVar13 = &local_f8;
          goto LAB_0010c885;
        }
        *(undefined8 *)(psVar14 + -8) = 0x10c826;
        iVar8 = snd_seq_port_info_get_port(psVar14);
        *(int *)((long)puVar3 + 0xc) = iVar8;
      }
      local_31 = (char)iVar8;
      if (puVar3[2] == 0) {
        puVar1 = puVar3 + 2;
        *(undefined8 *)(psVar14 + -8) = 0x10c93d;
        iVar8 = snd_seq_port_subscribe_malloc(puVar1);
        if (iVar8 < 0) {
          psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
          *(undefined8 *)(psVar14 + -8) = 0x10cae8;
          std::__cxx11::string::assign((char *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 0x10cafa;
          std::__cxx11::string::string((string *)&local_d8,(string *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 8;
          uVar5 = *(undefined8 *)(psVar14 + -8);
          *(undefined8 *)(psVar14 + -8) = 0x10cb08;
          MidiApi::error((MidiApi *)this,(Type)uVar5,&local_d8);
          psVar13 = &local_d8;
          goto LAB_0010c885;
        }
        uVar5 = puVar3[2];
        *(undefined8 *)(psVar14 + -8) = 0x10c952;
        snd_seq_port_subscribe_set_sender(uVar5,&local_58);
        uVar5 = puVar3[2];
        *(undefined8 *)(psVar14 + -8) = 0x10c95f;
        snd_seq_port_subscribe_set_dest(uVar5,&local_32);
        uVar5 = *puVar3;
        uVar7 = puVar3[2];
        *(undefined8 *)(psVar14 + -8) = 0x10c96c;
        iVar8 = snd_seq_subscribe_port(uVar5,uVar7);
        if (iVar8 != 0) {
          uVar5 = *puVar1;
          *(undefined8 *)(psVar14 + -8) = 0x10c97c;
          snd_seq_port_subscribe_free(uVar5);
          *puVar1 = 0;
          psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
          *(undefined8 *)(psVar14 + -8) = 0x10c993;
          std::__cxx11::string::assign((char *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 0x10c9a5;
          std::__cxx11::string::string((string *)&local_b8,(string *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 8;
          uVar5 = *(undefined8 *)(psVar14 + -8);
          *(undefined8 *)(psVar14 + -8) = 0x10c9b3;
          MidiApi::error((MidiApi *)this,(Type)uVar5,&local_b8);
          psVar13 = &local_b8;
          goto LAB_0010c885;
        }
      }
      if ((this->super_MidiInApi).inputData_.doInput == false) {
        uVar5 = *puVar3;
        uVar2 = *(undefined4 *)(puVar3 + 9);
        *(undefined8 *)(psVar14 + -8) = 0x1e;
        uVar7 = *(undefined8 *)(psVar14 + -8);
        *(undefined8 *)(psVar14 + -8) = 0x10c9d8;
        snd_seq_control_queue(uVar5,uVar2,uVar7,0,0);
        uVar5 = *puVar3;
        *(undefined8 *)(psVar14 + -8) = 0x10c9e1;
        snd_seq_drain_output(uVar5);
        *(undefined8 *)(psVar14 + -8) = 0x10c9f0;
        pthread_attr_init((pthread_attr_t *)local_2b0);
        *(undefined8 *)(psVar14 + -8) = 0x10c9fa;
        pthread_attr_setdetachstate((pthread_attr_t *)local_2b0,0);
        *(undefined8 *)(psVar14 + -8) = 0x10ca04;
        pthread_attr_setschedpolicy((pthread_attr_t *)local_2b0,0);
        (this->super_MidiInApi).inputData_.doInput = true;
        *(undefined8 *)(psVar14 + -8) = 0x10ca21;
        iVar8 = pthread_create(puVar3 + 6,(pthread_attr_t *)local_2b0,alsaMidiHandler,
                               &(this->super_MidiInApi).inputData_);
        *(undefined8 *)(psVar14 + -8) = 0x10ca2c;
        pthread_attr_destroy((pthread_attr_t *)local_2b0);
        if (iVar8 != 0) {
          uVar5 = *puVar3;
          uVar7 = puVar3[2];
          *(undefined8 *)(psVar14 + -8) = 0x10ca42;
          snd_seq_unsubscribe_port(uVar5,uVar7);
          uVar5 = puVar3[2];
          *(undefined8 *)(psVar14 + -8) = 0x10ca4b;
          snd_seq_port_subscribe_free(uVar5);
          puVar3[2] = 0;
          (this->super_MidiInApi).inputData_.doInput = false;
          psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
          *(undefined8 *)(psVar14 + -8) = 0x10ca6a;
          std::__cxx11::string::assign((char *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 0x10ca7c;
          std::__cxx11::string::string((string *)&local_98,(string *)psVar13);
          *(undefined8 *)(psVar14 + -8) = 10;
          uVar5 = *(undefined8 *)(psVar14 + -8);
          *(undefined8 *)(psVar14 + -8) = 0x10ca8a;
          MidiApi::error((MidiApi *)this,(Type)uVar5,&local_98);
          psVar13 = &local_98;
          goto LAB_0010c885;
        }
      }
      (this->super_MidiInApi).super_MidiApi.connected_ = true;
      return;
    }
    psVar13 = &(this->super_MidiInApi).super_MidiApi.errorString_;
    uStack_2c0 = 0x10c85e;
    std::__cxx11::string::assign((char *)psVar13);
    uStack_2c0 = 0x10c870;
    std::__cxx11::string::string((string *)&local_118,(string *)psVar13);
    uStack_2c0 = 0x10c87e;
    MidiApi::error((MidiApi *)this,NO_DEVICES_FOUND,&local_118);
    psVar13 = &local_118;
  }
LAB_0010c885:
  *(undefined8 *)(psVar14 + -8) = 0x10c88a;
  std::__cxx11::string::~string((string *)psVar13);
  return;
}

Assistant:

void MidiInAlsa :: openPort( unsigned int portNumber, const std::string &portName )
{
  if ( connected_ ) {
    errorString_ = "MidiInAlsa::openPort: a valid connection already exists!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  unsigned int nSrc = this->getPortCount();
  if ( nSrc < 1 ) {
    errorString_ = "MidiInAlsa::openPort: no MIDI input sources found!";
    error( RtMidiError::NO_DEVICES_FOUND, errorString_ );
    return;
  }

  snd_seq_port_info_t *src_pinfo;
  snd_seq_port_info_alloca( &src_pinfo );
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, src_pinfo, SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ, (int) portNumber ) == 0 ) {
    std::ostringstream ost;
    ost << "MidiInAlsa::openPort: the 'portNumber' argument (" << portNumber << ") is invalid.";
    errorString_ = ost.str();
    error( RtMidiError::INVALID_PARAMETER, errorString_ );
    return;
  }

  snd_seq_addr_t sender, receiver;
  sender.client = snd_seq_port_info_get_client( src_pinfo );
  sender.port = snd_seq_port_info_get_port( src_pinfo );
  receiver.client = snd_seq_client_id( data->seq );

  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  if ( data->vport < 0 ) {
    snd_seq_port_info_set_client( pinfo, 0 );
    snd_seq_port_info_set_port( pinfo, 0 );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels(pinfo, 16);
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo,  portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openPort: ALSA error creating input port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  receiver.port = data->vport;

  if ( !data->subscription ) {
    // Make subscription
    if ( snd_seq_port_subscribe_malloc( &data->subscription ) < 0 ) {
      errorString_ = "MidiInAlsa::openPort: ALSA error allocation port subscription.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    snd_seq_port_subscribe_set_sender( data->subscription, &sender );
    snd_seq_port_subscribe_set_dest( data->subscription, &receiver );
    if ( snd_seq_subscribe_port( data->seq, data->subscription ) ) {
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
      errorString_ = "MidiInAlsa::openPort: ALSA error making port connection.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
  }

  if ( inputData_.doInput == false ) {
    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      snd_seq_unsubscribe_port( data->seq, data->subscription );
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }

  connected_ = true;
}